

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.c
# Opt level: O0

int ffpcks(fitsfile *fptr,int *status)

{
  int iVar1;
  int iVar2;
  int *in_RSI;
  long in_RDI;
  double tdouble;
  unsigned_long sum;
  unsigned_long olddsum;
  unsigned_long dsum;
  LONGLONG dataend;
  LONGLONG datastart;
  LONGLONG headstart;
  long nrec;
  int tstatus;
  char datacomm [73];
  char chkcomm [73];
  char comm [73];
  char datasum [71];
  char checksum [71];
  char datestr [20];
  int *in_stack_00000950;
  fitsfile *in_stack_00000958;
  long in_stack_00000960;
  fitsfile *in_stack_00000968;
  int *in_stack_fffffffffffffde8;
  LONGLONG *in_stack_fffffffffffffdf0;
  LONGLONG *in_stack_fffffffffffffdf8;
  int *in_stack_fffffffffffffe00;
  fitsfile *headstart_00;
  fitsfile *in_stack_fffffffffffffe08;
  fitsfile *fptr_00;
  fitsfile *fptr_01;
  long local_1f0;
  long local_1e8;
  int *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  fitsfile *in_stack_fffffffffffffe48;
  int *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  unsigned_long in_stack_fffffffffffffeb0;
  int *in_stack_fffffffffffffef0;
  fitsfile *in_stack_fffffffffffffef8;
  char local_d8 [80];
  char local_88 [16];
  int *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  fitsfile *in_stack_ffffffffffffffa8;
  char local_38 [32];
  int *local_18;
  long local_10;
  int local_4;
  
  if (*in_RSI < 1) {
    local_18 = in_RSI;
    local_10 = in_RDI;
    ffgstm((char *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
           (int *)in_stack_fffffffffffffdf8);
    strcpy(&stack0xfffffffffffffe88,"HDU checksum updated ");
    strcat(&stack0xfffffffffffffe88,local_38);
    strcpy(&stack0xfffffffffffffe38,"data unit checksum updated ");
    strcat(&stack0xfffffffffffffe38,local_38);
    iVar2 = *local_18;
    iVar1 = ffgkys(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                   (char *)CONCAT44(iVar2,in_stack_fffffffffffffe30),in_stack_fffffffffffffe28);
    if (iVar1 == 0xca) {
      *local_18 = iVar2;
      strcpy(local_88,"0000000000000000");
      ffpkys((fitsfile *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe88);
    }
    iVar2 = *local_18;
    iVar1 = ffgkys(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                   (char *)CONCAT44(iVar2,in_stack_fffffffffffffe30),in_stack_fffffffffffffe28);
    if (iVar1 == 0xca) {
      *local_18 = iVar2;
      headstart_00 = (fitsfile *)0x0;
      ffpkys((fitsfile *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe88);
      iVar2 = strcmp(local_88,"0000000000000000");
      if (iVar2 != 0) {
        strcpy(local_88,"0000000000000000");
        ffmkys(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
    }
    else {
      in_stack_fffffffffffffdf0 = (LONGLONG *)atof(local_d8);
      headstart_00 = (fitsfile *)
                     ((long)(double)in_stack_fffffffffffffdf0 |
                     (long)((double)in_stack_fffffffffffffdf0 - 9.223372036854776e+18) &
                     (long)(double)in_stack_fffffffffffffdf0 >> 0x3f);
    }
    iVar2 = ffrdef(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    if (iVar2 < 1) {
      if (0 < *(long *)(*(long *)(local_10 + 8) + 0x3e0)) {
        ffuptf((fitsfile *)datacomm._24_8_,(int *)datacomm._16_8_);
      }
      iVar2 = ffpdfl(in_stack_00000958,in_stack_00000950);
      if (iVar2 < 1) {
        iVar2 = ffghadll(in_stack_fffffffffffffe08,(LONGLONG *)headstart_00,
                         in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                         in_stack_fffffffffffffde8);
        iVar1 = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
        if (iVar2 < 1) {
          fptr_00 = (fitsfile *)0x0;
          if (0 < (local_1f0 - local_1e8) / 0xb40) {
            ffmbyt((fitsfile *)0x0,(LONGLONG)headstart_00,iVar1,(int *)in_stack_fffffffffffffdf0);
            iVar2 = ffcsum(in_stack_00000968,in_stack_00000960,(unsigned_long *)in_stack_00000958,
                           in_stack_00000950);
            if (0 < iVar2) {
              return *local_18;
            }
          }
          if (fptr_00 != headstart_00) {
            snprintf(local_d8,0x47,"%lu",fptr_00);
            ffmkys(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
            iVar2 = strcmp(local_88,"0000000000000000");
            if (iVar2 != 0) {
              strcpy(local_88,"0000000000000000");
              ffmkys(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
            }
          }
          iVar2 = strcmp(local_88,"0000000000000000");
          fptr_01 = fptr_00;
          if (iVar2 != 0) {
            ffmbyt(fptr_00,(LONGLONG)headstart_00,iVar1,(int *)in_stack_fffffffffffffdf0);
            fptr_01 = fptr_00;
            iVar2 = ffcsum(in_stack_00000968,in_stack_00000960,(unsigned_long *)in_stack_00000958,
                           in_stack_00000950);
            if (0 < iVar2) {
              return *local_18;
            }
            if ((fptr_00 == (fitsfile *)0x0) || (fptr_00 == (fitsfile *)0xffffffff)) {
              return *local_18;
            }
            ffmkys(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
            iVar1 = (int)((ulong)fptr_00 >> 0x20);
          }
          ffmbyt(fptr_01,(LONGLONG)headstart_00,iVar1,(int *)in_stack_fffffffffffffdf0);
          iVar2 = ffcsum(in_stack_00000968,in_stack_00000960,(unsigned_long *)in_stack_00000958,
                         in_stack_00000950);
          if (iVar2 < 1) {
            ffesum(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea0);
            ffmkys(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
            local_4 = *local_18;
          }
          else {
            local_4 = *local_18;
          }
        }
        else {
          local_4 = *local_18;
        }
      }
      else {
        local_4 = *local_18;
      }
    }
    else {
      local_4 = *local_18;
    }
  }
  else {
    local_4 = *in_RSI;
  }
  return local_4;
}

Assistant:

int ffpcks(fitsfile *fptr,      /* I - FITS file pointer                  */
           int *status)         /* IO - error status                      */
/*
   Create or update the checksum keywords in the CHDU.  These keywords
   provide a checksum verification of the FITS HDU based on the ASCII
   coded 1's complement checksum algorithm developed by Rob Seaman at NOAO.
*/
{
    char datestr[20], checksum[FLEN_VALUE], datasum[FLEN_VALUE];
    char  comm[FLEN_COMMENT], chkcomm[FLEN_COMMENT], datacomm[FLEN_COMMENT];
    int tstatus;
    long nrec;
    LONGLONG headstart, datastart, dataend;
    unsigned long dsum, olddsum, sum;
    double tdouble;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* generate current date string and construct the keyword comments */
    ffgstm(datestr, NULL, status);
    strcpy(chkcomm, "HDU checksum updated ");
    strcat(chkcomm, datestr);
    strcpy(datacomm, "data unit checksum updated ");
    strcat(datacomm, datestr);

    /* write the CHECKSUM keyword if it does not exist */
    tstatus = *status;
    if (ffgkys(fptr, "CHECKSUM", checksum, comm, status) == KEY_NO_EXIST)
    {
        *status = tstatus;
        strcpy(checksum, "0000000000000000");
        ffpkys(fptr, "CHECKSUM", checksum, chkcomm, status);
    }

    /* write the DATASUM keyword if it does not exist */
    tstatus = *status;
    if (ffgkys(fptr, "DATASUM", datasum, comm, status) == KEY_NO_EXIST)
    {
        *status = tstatus;
        olddsum = 0;
        ffpkys(fptr, "DATASUM", "         0", datacomm, status);

        /* set the CHECKSUM keyword as undefined, if it isn't already */
        if (strcmp(checksum, "0000000000000000") )
        {
            strcpy(checksum, "0000000000000000");
            ffmkys(fptr, "CHECKSUM", checksum, chkcomm, status);
        }
    }
    else
    {
        /* decode the datasum into an unsigned long variable */

        /* olddsum = strtoul(datasum, 0, 10); doesn't work on SUN OS */

        tdouble = atof(datasum);
        olddsum = (unsigned long) tdouble;
    }

    /* close header: rewrite END keyword and following blank fill */
    /* and re-read the required keywords to determine the structure */
    if (ffrdef(fptr, status) > 0)
        return(*status);

    if ((fptr->Fptr)->heapsize > 0)
         ffuptf(fptr, status);  /* update the variable length TFORM values */

    /* write the correct data fill values, if they are not already correct */
    if (ffpdfl(fptr, status) > 0)
        return(*status);

    /* calc size of data unit, in FITS 2880-byte blocks */
    if (ffghadll(fptr, &headstart, &datastart, &dataend, status) > 0)
        return(*status);

    nrec = (long) ((dataend - datastart) / 2880);
    dsum = 0;

    if (nrec > 0)
    {
        /* accumulate the 32-bit 1's complement checksum */
        ffmbyt(fptr, datastart, REPORT_EOF, status);
        if (ffcsum(fptr, nrec, &dsum, status) > 0)
            return(*status);
    }

    if (dsum != olddsum)
    {
        /* update the DATASUM keyword with the correct value */ 
        snprintf(datasum, FLEN_VALUE, "%lu", dsum);
        ffmkys(fptr, "DATASUM", datasum, datacomm, status);

        /* set the CHECKSUM keyword as undefined, if it isn't already */
        if (strcmp(checksum, "0000000000000000") )
        {
            strcpy(checksum, "0000000000000000");
            ffmkys(fptr, "CHECKSUM", checksum, chkcomm, status);
        }
    }        

    if (strcmp(checksum, "0000000000000000") )
    {
        /* check if CHECKSUM is still OK; move to the start of the header */
        ffmbyt(fptr, headstart, REPORT_EOF, status);

        /* accumulate the header checksum into the previous data checksum */
        nrec = (long) ((datastart - headstart) / 2880);
        sum = dsum;
        if (ffcsum(fptr, nrec, &sum, status) > 0)
            return(*status);

        if (sum == 0 || sum == 0xFFFFFFFF)
           return(*status);            /* CHECKSUM is correct */

        /* Zero the CHECKSUM and recompute the new value */
        ffmkys(fptr, "CHECKSUM", "0000000000000000", chkcomm, status);
    }

    /* move to the start of the header */
    ffmbyt(fptr, headstart, REPORT_EOF, status);

    /* accumulate the header checksum into the previous data checksum */
    nrec = (long) ((datastart - headstart) / 2880);
    sum = dsum;
    if (ffcsum(fptr, nrec, &sum, status) > 0)
           return(*status);

    /* encode the COMPLEMENT of the checksum into a 16-character string */
    ffesum(sum, TRUE, checksum);

    /* update the CHECKSUM keyword value with the new string */
    ffmkys(fptr, "CHECKSUM", checksum, "&", status);

    return(*status);
}